

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O3

void comp_func_solid_Source_rgbafp_avx2
               (QRgbaFloat32 *dst,int length,QRgbaFloat32 color,uint const_alpha)

{
  QRgbaFloat32 *pQVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ulong uVar7;
  long lVar8;
  QRgbaFloat32 *pQVar9;
  float fVar10;
  undefined1 auVar11 [64];
  float fVar12;
  float fVar14;
  float fVar15;
  undefined1 auVar13 [64];
  float fVar16;
  
  auVar13._8_56_ = color._16_56_;
  auVar13._0_8_ = color._8_8_;
  auVar11._8_56_ = color._8_56_;
  auVar11._0_8_ = color._0_8_;
  auVar2 = vmovlhps_avx(auVar11._0_16_,auVar13._0_16_);
  if (const_alpha == 0xff) {
    if (0 < length) {
      lVar8 = 0;
      do {
        *(undefined1 (*) [16])((long)&dst->r + lVar8) = auVar2;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)(uint)length << 4 != lVar8);
    }
  }
  else {
    fVar10 = (float)const_alpha / 255.0;
    fVar16 = 0.0;
    fVar3 = 1.0 - fVar10;
    fVar12 = auVar2._0_4_ * fVar10;
    fVar14 = auVar2._4_4_ * fVar10;
    fVar15 = auVar2._8_4_ * fVar10;
    fVar10 = auVar2._12_4_ * fVar10;
    uVar7 = 0;
    if (1 < length) {
      uVar7 = 0;
      pQVar9 = dst;
      do {
        fVar4 = pQVar9[1].r;
        fVar5 = pQVar9[1].g;
        fVar6 = pQVar9[1].b;
        fVar16 = fVar10 + fVar16;
        pQVar9->r = fVar12 + fVar3 * pQVar9->r;
        pQVar9->g = fVar14 + fVar3 * pQVar9->g;
        pQVar9->b = fVar15 + fVar3 * pQVar9->b;
        pQVar9->a = fVar10 + fVar3 * pQVar9->a;
        pQVar9[1].r = fVar12 + fVar3 * fVar4;
        pQVar9[1].g = fVar14 + fVar3 * fVar5;
        pQVar9[1].b = fVar15 + fVar3 * fVar6;
        pQVar9[1].a = fVar16;
        uVar7 = uVar7 + 2;
        pQVar9 = pQVar9 + 2;
      } while (uVar7 < length - 1);
    }
    if ((int)uVar7 < length) {
      pQVar9 = dst + (uVar7 & 0xffffffff);
      pQVar1 = dst + (uVar7 & 0xffffffff);
      pQVar1->r = fVar12 + fVar3 * pQVar9->r;
      pQVar1->g = fVar14 + fVar3 * pQVar9->g;
      pQVar1->b = fVar15 + fVar3 * pQVar9->b;
      pQVar1->a = fVar10 + fVar3 * pQVar9->a;
      return;
    }
  }
  return;
}

Assistant:

void QT_FASTCALL comp_func_solid_Source_rgbafp_avx2(QRgbaFloat32 *dst, int length, QRgbaFloat32 color, uint const_alpha)
{
    Q_ASSERT(const_alpha < 256); // const_alpha is in [0-255]
    if (const_alpha == 255) {
        for (int i = 0; i < length; ++i)
            dst[i] = color;
    } else {
        const float a = const_alpha / 255.0f;
        const __m128 alphaVector = _mm_set1_ps(a);
        const __m128 minusAlphaVector = _mm_set1_ps(1.0f - a);
        __m128 colorVector = _mm_loadu_ps((const float *)&color);
        colorVector = _mm_mul_ps(colorVector, alphaVector);
        const __m256 colorVector256 = _mm256_insertf128_ps(_mm256_castps128_ps256(colorVector), colorVector, 1);
        const __m256 minusAlphaVector256 = _mm256_set1_ps(1.0f - a);
        int x = 0;
        for (; x < length - 1; x += 2) {
            __m256 dstVector = _mm256_loadu_ps((const float *)&dst[x]);
            dstVector = _mm256_mul_ps(dstVector, minusAlphaVector256);
            dstVector = _mm256_add_ps(dstVector, colorVector256);
            _mm256_storeu_ps((float *)&dst[x], dstVector);
        }
        if (x < length) {
            __m128 dstVector = _mm_loadu_ps((const float *)&dst[x]);
            dstVector = _mm_mul_ps(dstVector, minusAlphaVector);
            dstVector = _mm_add_ps(dstVector, colorVector);
            _mm_storeu_ps((float *)&dst[x], dstVector);
        }
    }
}